

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_stats.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int code_00;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  int local_78;
  int ii;
  int doh;
  int doz;
  int doi;
  int dod;
  int doq;
  int iarg;
  int code;
  double vdel;
  double vtop;
  double vbot;
  double p3;
  double p2;
  double p1;
  double p;
  double val;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  p2 = 0.0;
  p3 = 0.0;
  vbot = 0.0;
  dod = 1;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar7 = false;
  val = (double)argv;
  argv_local._0_4_ = argc;
  if ((argc < 3) || (pcVar6 = strstr(argv[1],"help"), pcVar6 != (char *)0x0)) {
    printf("\n");
    printf("Demo program for computing NIfTI statistical functions.\n");
    printf("Usage: nifti_stats [-q|-d|-1|-z] val CODE [p1 p2 p3]\n");
    printf(" val can be a single number or in the form bot:top:step.\n");
    printf(" default ==> output p = Prob(statistic < val).\n");
    printf("  -q     ==> output is 1-p.\n");
    printf("  -d     ==> output is density.\n");
    printf("  -1     ==> output is x such that Prob(statistic < x) = val.\n");
    printf("  -z     ==> output is z such that Normal cdf(z) = p(val).\n");
    printf("  -h     ==> output is z such that 1/2-Normal cdf(z) = p(val).\n");
    printf(" Allowable CODEs:\n");
    for (local_78 = 2; local_78 < 0x19; local_78 = local_78 + 1) {
      printf("  %-10s",inam[local_78]);
      if ((local_78 + -2) % 6 == 5) {
        printf("\n");
      }
    }
    printf("\n");
    printf(" Following CODE are distributional parameters, as needed.\n");
    printf("\n");
    printf("Results are written to stdout, 1 number per output line.\n");
    printf("Example (piping output into AFNI program 1dplot):\n");
    printf(" nifti_stats -d 0:4:.001 INVGAUSS 1 3 | 1dplot -dx 0.001 -stdin\n");
    printf("\n");
    printf("Author - RW Cox - SSCC/NIMH/NIH/DHHS/USA/EARTH - March 2004\n");
    printf("\n");
    exit(0);
  }
  iVar5 = strcmp(*(char **)((long)val + 8),"-q");
  if (iVar5 == 0) {
    bVar1 = true;
    dod = 2;
  }
  else {
    iVar5 = strcmp(*(char **)((long)val + 8),"-d");
    if (iVar5 == 0) {
      bVar2 = true;
      dod = 2;
    }
    else {
      iVar5 = strcmp(*(char **)((long)val + 8),"-1");
      if (iVar5 == 0) {
        bVar3 = true;
        dod = 2;
      }
      else {
        iVar5 = strcmp(*(char **)((long)val + 8),"-z");
        if (iVar5 == 0) {
          bVar4 = true;
          dod = 2;
        }
        else {
          iVar5 = strcmp(*(char **)((long)val + 8),"-h");
          bVar7 = iVar5 == 0;
          if (bVar7) {
            dod = 2;
          }
        }
      }
    }
  }
  _iarg = 0.0;
  vdel = 0.0;
  vtop = 0.0;
  __isoc99_sscanf(*(undefined8 *)((long)val + (long)dod * 8),"%lf:%lf:%lf",&vtop,&vdel,&iarg);
  if (vdel <= vtop) {
    _iarg = 0.0;
  }
  if (_iarg <= 0.0) {
    vdel = vtop;
  }
  iVar5 = dod + 2;
  code_00 = nifti_intent_code(*(char **)((long)val + (long)(dod + 1) * 8));
  if (code_00 < 0) {
    fprintf(_stderr,"illegal code=%s\n",*(undefined8 *)((long)val + (long)(dod + 1) * 8));
    exit(1);
  }
  if (iVar5 < (int)argv_local) {
    p2 = strtod(*(char **)((long)val + (long)iVar5 * 8),(char **)0x0);
    iVar5 = dod + 3;
  }
  dod = iVar5;
  if (dod < (int)argv_local) {
    p3 = strtod(*(char **)((long)val + (long)dod * 8),(char **)0x0);
    dod = dod + 1;
  }
  if (dod < (int)argv_local) {
    vbot = strtod(*(char **)((long)val + (long)dod * 8),(char **)0x0);
  }
  for (p = vtop; p <= vdel; p = _iarg + p) {
    if (bVar1) {
      p1 = nifti_stat2rcdf(p,code_00,p2,p3,vbot);
    }
    else if (bVar2) {
      dVar8 = nifti_stat2cdf(p + 0.001,code_00,p2,p3,vbot);
      dVar9 = nifti_stat2cdf(p,code_00,p2,p3,vbot);
      p1 = (dVar8 - dVar9) * 1000.0;
    }
    else if (bVar3) {
      p1 = nifti_cdf2stat(p,code_00,p2,p3,vbot);
    }
    else if (bVar4) {
      p1 = nifti_stat2zscore(p,code_00,p2,p3,vbot);
    }
    else if (bVar7) {
      p1 = nifti_stat2hzscore(p,code_00,p2,p3,vbot);
    }
    else {
      p1 = nifti_stat2cdf(p,code_00,p2,p3,vbot);
    }
    printf("%.9g\n",p1);
    if (_iarg <= 0.0) break;
  }
  exit(0);
}

Assistant:

int main( int argc , char *argv[] )
{
   double val , p , p1=0.0,p2=0.0,p3=0.0 ;
   double vbot,vtop,vdel ;
   int code , iarg=1 , doq=0 , dod=0 , doi=0 , doz=0 , doh=0 ;

   /*-- print some help for the pitiful user --*/

   if( argc < 3 || strstr(argv[1],"help") != NULL ){
    int ii ;
    printf("\n") ;
    printf("Demo program for computing NIfTI statistical functions.\n") ;
    printf("Usage: nifti_stats [-q|-d|-1|-z] val CODE [p1 p2 p3]\n") ;
    printf(" val can be a single number or in the form bot:top:step.\n") ;
    printf(" default ==> output p = Prob(statistic < val).\n") ;
    printf("  -q     ==> output is 1-p.\n") ;
    printf("  -d     ==> output is density.\n") ;
    printf("  -1     ==> output is x such that Prob(statistic < x) = val.\n") ;
    printf("  -z     ==> output is z such that Normal cdf(z) = p(val).\n") ;
    printf("  -h     ==> output is z such that 1/2-Normal cdf(z) = p(val).\n");
    printf(" Allowable CODEs:\n") ;
    for( ii=NIFTI_FIRST_STATCODE ; ii <= NIFTI_LAST_STATCODE ; ii++ ){
     printf("  %-10s",inam[ii]); if((ii-NIFTI_FIRST_STATCODE)%6==5)printf("\n");
    }
    printf("\n") ;
    printf(" Following CODE are distributional parameters, as needed.\n");
    printf("\n") ;
    printf("Results are written to stdout, 1 number per output line.\n") ;
    printf("Example (piping output into AFNI program 1dplot):\n") ;
    printf(" nifti_stats -d 0:4:.001 INVGAUSS 1 3 | 1dplot -dx 0.001 -stdin\n");
    printf("\n") ;
    printf("Author - RW Cox - SSCC/NIMH/NIH/DHHS/USA/EARTH - March 2004\n") ;
    printf("\n") ;
    exit(0) ;
   }

   /*-- check first arg to see if it is an output option;
        if so, set the appropriate output flag to determine what to compute --*/

        if( strcmp(argv[iarg],"-q") == 0 ){ doq = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-d") == 0 ){ dod = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-1") == 0 ){ doi = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-z") == 0 ){ doz = 1 ; iarg++ ; }
   else if( strcmp(argv[iarg],"-h") == 0 ){ doh = 1 ; iarg++ ; }

   /*-- get the value(s) to process --*/

   vbot=vtop=vdel = 0.0 ;
   sscanf( argv[iarg++] , "%lf:%lf:%lf" , &vbot,&vtop,&vdel ) ;
   if( vbot >= vtop ) vdel = 0.0 ;
   if( vdel <= 0.0  ) vtop = vbot ;

   /*-- decode the CODE into the integer signifying the distribution --*/

   code = nifti_intent_code(argv[iarg++]) ;
     if( code < 0 ){ fprintf(stderr,"illegal code=%s\n",argv[iarg-1]); exit(1); }

   /*-- get the parameters, if present (defaults are 0) --*/

   if( argc > iarg ) p1 = strtod(argv[iarg++],NULL) ;
   if( argc > iarg ) p2 = strtod(argv[iarg++],NULL) ;
   if( argc > iarg ) p3 = strtod(argv[iarg++],NULL) ;

   /*-- loop over input value(s), compute output, write to stdout --*/

   for( val=vbot ; val <= vtop ; val += vdel ){
     if( doq )                                        /* output = 1-cdf */
       p = nifti_stat2rcdf( val , code,p1,p2,p3 ) ;
     else if( dod )                                   /* output = density */
       p = 1000.0*( nifti_stat2cdf(val+.001,code,p1,p2,p3)
                   -nifti_stat2cdf(val     ,code,p1,p2,p3)) ;
     else if( doi )                                   /* output = inverse */
       p = nifti_cdf2stat( val , code,p1,p2,p3 ) ;
     else if( doz )                                   /* output = z score */
       p = nifti_stat2zscore( val , code,p1,p2,p3 ) ;
     else if( doh )                                   /* output = halfz score */
       p = nifti_stat2hzscore( val , code,p1,p2,p3 ) ;
     else                                              /* output = cdf */
       p = nifti_stat2cdf( val , code,p1,p2,p3 ) ;

     printf("%.9g\n",p) ;
     if( vdel <= 0.0 ) break ;  /* the case of just 1 value */
   }

   /*-- terminus est --*/

   exit(0) ;
}